

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseComponent.cpp
# Opt level: O0

void __thiscall BaseComponent::Subscribe(BaseComponent *this,Type type)

{
  bool bVar1;
  __normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
  __last;
  unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
  *this_00;
  mapped_type *__x;
  __normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
  in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
  *in_stack_ffffffffffffff80;
  BaseComponent **in_stack_ffffffffffffff88;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::
  unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
  ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::begin
            ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)in_stack_ffffffffffffff78)
  ;
  __last._M_current =
       (BaseComponent **)
       std::
       unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
       ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::end
            ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)in_stack_ffffffffffffff78)
  ;
  std::
  find<__gnu_cxx::__normal_iterator<BaseComponent**,std::vector<BaseComponent*,std::allocator<BaseComponent*>>>,BaseComponent*>
            (in_RDI,__last,in_stack_ffffffffffffff88);
  this_00 = (unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
             *)std::
               unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
               ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
  std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::end
            ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)in_stack_ffffffffffffff78)
  ;
  bVar1 = __gnu_cxx::operator==
                    ((__normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
                      *)this_00,
                     (__normal_iterator<BaseComponent_**,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>
                      *)in_stack_ffffffffffffff78);
  if (bVar1) {
    __x = std::
          unordered_map<int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>_>_>_>
          ::operator[](this_00,(key_type *)in_stack_ffffffffffffff78);
    std::vector<BaseComponent_*,_std::allocator<BaseComponent_*>_>::push_back
              ((vector<BaseComponent_*,_std::allocator<BaseComponent_*>_> *)this_00,
               (value_type *)__x);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1085e4);
  return;
}

Assistant:

void BaseComponent::Subscribe(Event::Type type) {
    std::lock_guard<std::mutex> lock(eventsLock);
    
    if(
        std::find(
            events[type].begin(), events[type].end(),
            this
        ) == events[type].end()
    ) {
        events[type].push_back(this);
    }
}